

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

bool_t memIsDisjoint3(void *buf1,size_t count1,void *buf2,size_t count2,void *buf3,size_t count3)

{
  bool_t bVar1;
  size_t in_RCX;
  void *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  void *in_R8;
  size_t in_R9;
  undefined1 local_31;
  
  bVar1 = memIsDisjoint2(in_RDI,in_RSI,in_RDX,in_RCX);
  local_31 = false;
  if (bVar1 != 0) {
    bVar1 = memIsDisjoint2(in_RDI,in_RSI,in_R8,in_R9);
    local_31 = false;
    if (bVar1 != 0) {
      bVar1 = memIsDisjoint2(in_RDX,in_RCX,in_R8,in_R9);
      local_31 = bVar1 != 0;
    }
  }
  return (bool_t)local_31;
}

Assistant:

bool_t memIsDisjoint3(const void* buf1, size_t count1,
	const void* buf2, size_t count2,
	const void* buf3, size_t count3)
{
	return memIsDisjoint2(buf1, count1, buf2, count2) &&
		memIsDisjoint2(buf1, count1, buf3, count3) &&
		memIsDisjoint2(buf2, count2, buf3, count3);
}